

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void CVmObjGramProd::process_work_queue_head
               (CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,CVmGramProdQueue *queues,
               CVmObjDict *dict)

{
  size_t *psVar1;
  vm_prop_id_t vVar2;
  vm_obj_id_t vVar3;
  uint uVar4;
  CVmGramProdState *pCVar5;
  CVmGramProdState *pCVar6;
  CVmObjPageEntry *pCVar7;
  int iVar8;
  int iVar9;
  CVmGramProdMatch *pCVar10;
  size_t sVar11;
  vmgram_alt_info *pvVar12;
  CVmGramProdMatchEntry *pCVar13;
  ulong uVar14;
  vm_prop_id_t *pvVar15;
  size_t sVar16;
  vmgram_tok_info *pvVar17;
  ulong uVar18;
  vm_val_t match_result;
  
  pCVar5 = queues->work_queue_;
  queues->work_queue_ = pCVar5->nxt_;
  pCVar5->nxt_ = (CVmGramProdState *)0x0;
  pvVar12 = pCVar5->altp_;
  uVar18 = pvVar12->tok_cnt;
  if (pCVar5->alt_pos_ < uVar18) {
    pvVar17 = pvVar12->toks + pCVar5->alt_pos_;
    iVar9 = 0;
    do {
      match_result.typ = VM_NIL;
      switch(pvVar17->typ) {
      case '\x01':
        uVar4 = (pvVar17->typinfo).prod_obj;
        iVar9 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar4 >> 0xc][uVar4 & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[uVar4 >> 0xc] + (uVar4 & 0xfff),metaclass_reg_);
        if (iVar9 != 0) {
          pCVar7 = G_obj_table_X.pages_[uVar4 >> 0xc];
          pCVar5->sub_target_prop_ = pvVar17->prop;
          enqueue_alts((CVmObjGramProd *)((long)&pCVar7->ptr_ + (ulong)((uVar4 & 0xfff) * 0x18)),mem
                       ,tok,tok_cnt,pCVar5->tok_pos_,pCVar5,queues,uVar4,0,(CVmGramProdMatch *)0x0,
                       dict);
          return;
        }
        goto LAB_00293945;
      case '\x02':
        uVar18 = pCVar5->tok_pos_;
        if (tok_cnt <= uVar18) {
          return;
        }
        if (tok[uVar18].match_cnt_ == 0) {
          return;
        }
        sVar11 = 0;
        while (tok[uVar18].matches_[sVar11].prop != (pvVar17->typinfo).speech_prop) {
          sVar11 = sVar11 + 1;
          if (tok[uVar18].match_cnt_ == sVar11) {
            return;
          }
        }
        break;
      case '\x03':
        uVar18 = pCVar5->tok_pos_;
        if (tok_cnt <= uVar18) {
          return;
        }
        if ((pvVar17->typinfo).lit.hash != tok[uVar18].hash_) {
          return;
        }
        iVar8 = tok_equals_lit(tok + uVar18,(pvVar17->typinfo).lit.str,(pvVar17->typinfo).lit.len,
                               dict,&match_result);
        if (iVar8 == 0) {
          return;
        }
        break;
      case '\x04':
        if (tok_cnt <= pCVar5->tok_pos_) {
          return;
        }
        if (tok[pCVar5->tok_pos_].typ_ != (ulong)(pvVar17->typinfo).prod_obj) {
          return;
        }
        break;
      case '\x05':
        pCVar5->matched_star_ = 1;
        iVar9 = 1;
        break;
      case '\x06':
        uVar18 = pCVar5->tok_pos_;
        if (tok_cnt <= uVar18) {
          return;
        }
        sVar11 = (pvVar17->typinfo).nspeech.cnt;
        if (sVar11 == 0) {
          return;
        }
        pvVar15 = (pvVar17->typinfo).nspeech.props;
        do {
          if (tok[uVar18].match_cnt_ != 0) {
            sVar16 = 0;
            do {
              if (tok[uVar18].matches_[sVar16].prop == *pvVar15) goto switchD_00293599_default;
              sVar16 = sVar16 + 1;
            } while (tok[uVar18].match_cnt_ != sVar16);
          }
          pvVar15 = pvVar15 + 1;
          sVar11 = sVar11 - 1;
          if (sVar11 == 0) {
            return;
          }
        } while( true );
      }
switchD_00293599_default:
      sVar11 = pCVar5->tok_pos_;
      vVar2 = pvVar17->prop;
      pCVar10 = (CVmGramProdMatch *)CVmGramProdMem::alloc(mem,0x38);
      pCVar10->tok_pos_ = sVar11;
      pCVar10->matched_star_ = iVar9;
      pCVar10->target_prop_ = vVar2;
      *(undefined8 *)&pCVar10->proc_obj_ = 0;
      *(undefined8 *)((long)&pCVar10->sub_match_list_ + 4) = 0;
      *(undefined4 *)((long)&pCVar10->sub_match_cnt_ + 4) = 0;
      *(ulong *)&pCVar10->tok_match_result_ = CONCAT44(match_result._4_4_,match_result.typ);
      (pCVar10->tok_match_result_).val = match_result.val;
      pCVar5->match_list_[pCVar5->alt_pos_] = pCVar10;
      uVar14 = pCVar5->alt_pos_ + 1;
      pCVar5->alt_pos_ = uVar14;
      if (pCVar5->matched_star_ == 0) {
        pCVar5->tok_pos_ = pCVar5->tok_pos_ + 1;
      }
      pvVar17 = pvVar17 + 1;
      pvVar12 = pCVar5->altp_;
      uVar18 = pvVar12->tok_cnt;
    } while (uVar14 < uVar18);
  }
  if (pCVar5->enclosing_ == (CVmGramProdState *)0x0) {
    vVar2 = 0;
  }
  else {
    vVar2 = pCVar5->enclosing_->sub_target_prop_;
  }
  sVar11 = pCVar5->tok_pos_;
  vVar3 = pvVar12->proc_obj;
  pCVar10 = (CVmGramProdMatch *)CVmGramProdMem::alloc(mem,0x38);
  pCVar10->tok_pos_ = sVar11;
  pCVar10->matched_star_ = 0;
  pCVar10->target_prop_ = vVar2;
  pCVar10->proc_obj_ = vVar3;
  pCVar10->sub_match_list_ = pCVar5->match_list_;
  pCVar10->sub_match_cnt_ = uVar18;
  (pCVar10->tok_match_result_).typ = VM_NIL;
  if (pCVar5->circular_alt_ != 0) {
    iVar9 = (**(code **)(*(long *)&G_obj_table_X.pages_[pCVar5->prod_obj_ >> 0xc]
                                   [pCVar5->prod_obj_ & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[pCVar5->prod_obj_ >> 0xc] + (pCVar5->prod_obj_ & 0xfff),
                       metaclass_reg_);
    if (iVar9 == 0) {
LAB_00293945:
      err_throw(0x7e6);
    }
    uVar4 = pCVar5->prod_obj_;
    enqueue_alts((CVmObjGramProd *)
                 ((long)&G_obj_table_X.pages_[uVar4 >> 0xc]->ptr_ + (ulong)((uVar4 & 0xfff) * 0x18))
                 ,mem,tok,tok_cnt,pCVar5->tok_pos_,pCVar5->enclosing_,queues,uVar4,1,pCVar10,dict);
  }
  pCVar6 = pCVar5->enclosing_;
  if (pCVar6 == (CVmGramProdState *)0x0) {
    if ((tok_cnt <= pCVar5->tok_pos_) || (pCVar5->matched_star_ != 0)) {
      pCVar13 = (CVmGramProdMatchEntry *)CVmGramProdMem::alloc(mem,0x18);
      pCVar13->match_ = pCVar10;
      pCVar13->tok_pos_ = pCVar5->tok_pos_;
      pCVar13->nxt_ = queues->success_list_;
      queues->success_list_ = pCVar13;
    }
  }
  else {
    pCVar6->match_list_[pCVar6->alt_pos_] = pCVar10;
    psVar1 = &pCVar5->enclosing_->alt_pos_;
    *psVar1 = *psVar1 + 1;
    pCVar5->enclosing_->tok_pos_ = pCVar5->tok_pos_;
    pCVar5->enclosing_->matched_star_ = pCVar5->matched_star_;
    pCVar5 = pCVar5->enclosing_;
    pCVar5->nxt_ = queues->work_queue_;
    queues->work_queue_ = pCVar5;
  }
  return;
}

Assistant:

void CVmObjGramProd::process_work_queue_head(VMG_ CVmGramProdMem *mem,
                                             const vmgramprod_tok *tok,
                                             size_t tok_cnt,
                                             CVmGramProdQueue *queues,
                                             CVmObjDict *dict)
{
    CVmGramProdState *state;
    CVmGramProdMatch *match;
    const vmgram_tok_info *tokp;
    int tok_matched_star;
    vm_prop_id_t enclosing_target_prop;
    
    /* get the first entry from the queue */
    state = queues->work_queue_;

    /* unlink this entry from the queue */
    queues->work_queue_ = state->nxt_;
    state->nxt_ = 0;

    /* get the token pointer for the next active entry in the alternative */
    tokp = state->altp_->toks + state->alt_pos_;

    /* presume we won't match a '*' token */
    tok_matched_star = FALSE;

    /* process the remaining items in the entry */
    while (state->alt_pos_ < state->altp_->tok_cnt)
    {
        int match;
        vm_val_t match_result;

        /* presume we won't find a match */
        match_result.set_nil();

        /* see what we have for this token */
        switch(tokp->typ)
        {
        case VMGRAM_MATCH_PROD:
            {
                vm_obj_id_t sub_obj_id;
                CVmObjGramProd *sub_objp;

                /*
                 *   This is a sub-production node.  Get the
                 *   sub-production object.  
                 */
                sub_obj_id = tokp->typinfo.prod_obj;

                /* make sure it's of the correct metaclass */
                if (!CVmObjGramProd::is_gramprod_obj(vmg_ sub_obj_id))
                {
                    /* wrong type - throw an error */
                    err_throw(VMERR_INVAL_OBJ_TYPE);
                }

                /* get the sub-production object */
                sub_objp = (CVmObjGramProd *)vm_objp(vmg_ sub_obj_id);

                /* 
                 *   set my subproduction target property, so that the
                 *   sub-production can set the target property correctly 
                 */
                state->sub_target_prop_ = tokp->prop;
                
                /* enqueue the alternatives for the sub-production */
                sub_objp->enqueue_alts(vmg_ mem, tok, tok_cnt,
                                       state->tok_pos_, state, queues,
                                       sub_obj_id, FALSE, 0, dict);
            }

            /* 
             *   Do not process the current state any further for now -
             *   we'll get back to it when (and if) we finish processing
             *   the sub-production.  Note that we don't even put the
             *   current state back in the queue - it's stacked behind the
             *   sub-production, and will be re-enqueued when we
             *   successfully finish with the sub-production.  
             */
            return;
            
        case VMGRAM_MATCH_SPEECH:
            /* part of speech - check to see if the current token matches */
            match = (state->tok_pos_ < tok_cnt
                     && find_prop_in_tok(&tok[state->tok_pos_],
                                         tokp->typinfo.speech_prop));
            break;

        case VMGRAM_MATCH_NSPEECH:
            /* 
             *   multiple parts of speech - check to see if the current token
             *   matches any of the parts of the speech 
             */
            if (state->tok_pos_ < tok_cnt)
            {
                size_t rem;
                const vm_prop_id_t *prop;

                /* presume we won't find a match */
                match = FALSE;

                /* check each item in the list */
                for (prop = tokp->typinfo.nspeech.props,
                     rem = tokp->typinfo.nspeech.cnt ;
                     rem != 0 ; --rem, ++prop)
                {
                    /* if this one matches, we have a match */
                    if (find_prop_in_tok(&tok[state->tok_pos_], *prop))
                    {
                        /* note the match */
                        match = TRUE;

                        /* no need to look any further at this token */
                        break;
                    }
                }
            }
            else
            {
                /* 
                 *   we're out of tokens, so we definitely don't have a
                 *   match, since we must match at least one of the possible
                 *   parts of speech of this item 
                 */
                match = FALSE;
            }
            break;
            
        case VMGRAM_MATCH_LITERAL:
            /* 
             *   Literal - check for a match to the string.  Test the hash
             *   values first, as this is much faster than comparing the
             *   strings, and at least tells us if the strings fail to match
             *   (and failing to match being by far the most common case,
             *   this saves us doing a full comparison most of the time).  
             */
            match = (state->tok_pos_ < tok_cnt
                     && tokp->typinfo.lit.hash == tok[state->tok_pos_].hash_
                     && tok_equals_lit(vmg_ &tok[state->tok_pos_],
                                       tokp->typinfo.lit.str,
                                       tokp->typinfo.lit.len,
                                       dict, &match_result));
            break;
            
        case VMGRAM_MATCH_TOKTYPE:
            /* token type */
            match = (state->tok_pos_ < tok_cnt
                     && (tok[state->tok_pos_].typ_
                         == tokp->typinfo.toktyp_enum));
            break;

        case VMGRAM_MATCH_STAR:
            /* 
             *   this matches anything remaining (it also matches if
             *   there's nothing remaining) 
             */
            match = TRUE;

            /* note that we matched a star in the state */
            state->matched_star_ = TRUE;

            /* note that we matched a star for this particular token */
            tok_matched_star = TRUE;
            break;
        }

        /* check for a match */
        if (match)
        {
            /* 
             *   we matched this token - add a token match to our state's
             *   match list for the current position 
             */
            state->match_list_[state->alt_pos_] =
                CVmGramProdMatch::alloc(mem, state->tok_pos_, &match_result,
                                        tok_matched_star, tokp->prop,
                                        VM_INVALID_OBJ, 0, 0);

            /* we're done with this alternative item - move on */
            state->alt_pos_++;

            /* 
             *   If we matched a real token, consume the matched input
             *   token.  For a '*', we don't want to consume anything, since
             *   a '*' merely stops parsing and doesn't actually match
             *   anything.  
             */
            if (!state->matched_star_)
                state->tok_pos_++;
            
            /* move on to the next alternative token item */
            ++tokp;
        }
        else
        {
            /* 
             *   This is not a match - reject this alternative.  We do not
             *   need to process this item further, so we can stop now,
             *   without returning this state to the work queue.  Simply
             *   abandon this work queue item.  
             */
            return;
        }
    }

    /* 
     *   If we make it here, we've reached the end of this alternative and
     *   have matched everything in it.  This means that the alternative
     *   was successful, so we can perform a 'reduce' operation to replace
     *   the matched tokens with this production.  
     */

    /* if we have an enclosing state, get its target property */
    enclosing_target_prop = (state->enclosing_ != 0
                             ? state->enclosing_->sub_target_prop_
                             : VM_INVALID_PROP);

    /* create a match for the entire alternative (i.e., the subproduction) */
    match = CVmGramProdMatch::alloc(
        mem, state->tok_pos_, 0, FALSE, enclosing_target_prop,
        state->altp_->proc_obj, &state->match_list_[0],
        state->altp_->tok_cnt);

    /*
     *   If the state we just matched was marked on creation as coming
     *   from an alternative with circular alternatives, we've just come
     *   up with a match for each circular alternative.  To avoid infinite
     *   recursion, we never enqueue the circular alternatives; however,
     *   now that we know we have a match for the first element of each
     *   circular alternative, we can check each of them to see if we can
     *   enqueue them.
     */
    if (state->circular_alt_)
    {
        vm_obj_id_t prod_obj_id;
        CVmObjGramProd *prod_objp;

        /* 
         *   Get the production from which this alternative came (there
         *   should be no need to check the metaclass, since we could only
         *   have created the state object from a valid production in the
         *   first place).
         *   
         *   First, make sure it's of the correct class.  (It almost
         *   certainly is, since the compiler should have generated this
         *   reference automatically, so there should be no possibility of a
         *   user error.  However, if it's not a production object, we'll
         *   probably crash by blindly casting it to one; so we'll check
         *   here, just to be sure that the compiler didn't do something
         *   wrong and the image file didn't become corrupted.)  
         */
        if (!CVmObjGramProd::is_gramprod_obj(vmg_ state->prod_obj_))
        {
            /* wrong type - throw an error */
            err_throw(VMERR_INVAL_OBJ_TYPE);
        }

        /* get the object, properly cast */
        prod_obj_id = state->prod_obj_;
        prod_objp = (CVmObjGramProd *)vm_objp(vmg_ prod_obj_id);

        /* 
         *   Enqueue the matching circular alternatives from the original
         *   production.  Our match becomes the first token match in the
         *   circular alternative (i.e., it matches the leading circular
         *   reference element).  
         */
        prod_objp->enqueue_alts(vmg_ mem, tok, tok_cnt, state->tok_pos_,
                                state->enclosing_, queues, prod_obj_id,
                                TRUE, match, dict);
    }

    /* check for an enclosing state to pop */
    if (state->enclosing_ != 0)
    {
        /* add the match to the enclosing state's match list */
        state->enclosing_->match_list_[state->enclosing_->alt_pos_] = match;
        state->enclosing_->alt_pos_++;

        /* 
         *   Move the enclosing state's token position to our token position
         *   - since it now encompasses our match, it has consumed all of
         *   the tokens therein.  Likewise, set the '*' flag in the parent
         *   to our own setting.  
         */
        state->enclosing_->tok_pos_ = state->tok_pos_;
        state->enclosing_->matched_star_ = state->matched_star_;

        /* enqueue the enclosing state so we can continue parsing it */
        enqueue_state(state->enclosing_, queues);
    }
    else
    {
        CVmGramProdMatchEntry *entry;
        
        /* 
         *   This is a top-level state, so we've completed parsing.  If
         *   we've consumed all input, or we matched a '*' token, we were
         *   successful.  If there's more input remaining, this is not a
         *   match.  
         */
        if (state->tok_pos_ < tok_cnt && !state->matched_star_)
        {
            /*
             *   There's more input remaining, so this isn't a match.
             *   Reject this alternative.  We do not need to process this
             *   item further, so stop now without returning this state
             *   object to the work queue. 
             */

            /* abandon this work queue item */
            return;
        }

        /* create a new entry for the match list */
        entry = (CVmGramProdMatchEntry *)mem->alloc(sizeof(*entry));
        entry->match_ = match;
        entry->tok_pos_ = state->tok_pos_;

        /* link the entry into the list */
        entry->nxt_ = queues->success_list_;
        queues->success_list_ = entry;
    }
}